

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow(bool *p_open)

{
  bool *v;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiViewportP *pIVar4;
  ImGuiPopupData *pIVar5;
  undefined8 *puVar6;
  undefined1 auVar7 [32];
  ImGuiContext *pIVar8;
  int *piVar9;
  int *piVar10;
  bool bVar11;
  ImGuiContext *g;
  ImDrawList *pIVar12;
  ImU32 col;
  ImGuiContext *g_8;
  char *pcVar13;
  undefined1 auVar14 [8];
  char *pcVar15;
  int rect_n;
  long lVar16;
  ImGuiTable *pIVar17;
  ImGuiWindowSettings *p;
  ImGuiTableSettings *settings;
  int iVar18;
  long lVar19;
  long lVar20;
  char *pcVar21;
  ImGuiContext *pIVar22;
  ImVector<ImDrawList_*> *pIVar23;
  uint uVar24;
  ImGuiContext *g_6;
  ulong uVar25;
  int rect_n_1;
  ulong uVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar42;
  undefined1 auVar37 [64];
  undefined1 auVar43 [56];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar53 [56];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double dVar56;
  undefined1 auVar57 [16];
  undefined8 uVar60;
  undefined1 in_ZMM7 [64];
  undefined1 auVar59 [64];
  ImRect IVar61;
  ImVec2 local_1d8;
  ImGuiContext *local_1d0;
  ImGuiMetricsConfig *local_1c8;
  int *local_1c0;
  int *local_1b8;
  ImVec2 local_1b0;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  char buf [128];
  char *trt_rects_names [13];
  char *wrt_rects_names [8];
  undefined1 auVar58 [16];
  
  auVar57 = in_ZMM7._0_16_;
  bVar11 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  pIVar22 = GImGui;
  if (!bVar11) {
    End();
    return;
  }
  Text("Dear ImGui %s","1.82 WIP");
  fVar27 = (pIVar22->IO).Framerate;
  auVar45._0_8_ = (double)fVar27;
  auVar45._8_8_ = 0;
  Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / fVar27));
  iVar18 = (pIVar22->IO).MetricsRenderIndices;
  Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar22->IO).MetricsRenderVertices,
       (long)iVar18,(ulong)(uint)(iVar18 / 3));
  Text("%d active windows (%d visible)",(ulong)(uint)(pIVar22->IO).MetricsActiveWindows,
       (ulong)(uint)(pIVar22->IO).MetricsRenderWindows);
  Text("%d active allocations",(ulong)(uint)(pIVar22->IO).MetricsActiveAllocations);
  Separator();
  auVar7 = _PTR_anon_var_dwarf_13bdfb_002a5a30;
  wrt_rects_names[4] = "WorkRect";
  wrt_rects_names[5] = "Content";
  wrt_rects_names[6] = "ContentIdeal";
  wrt_rects_names[7] = "ContentRegionRect";
  wrt_rects_names[0] = "OuterRect";
  wrt_rects_names[1] = "OuterRectClipped";
  wrt_rects_names[2] = "InnerRect";
  wrt_rects_names[3] = "InnerClipRect";
  trt_rects_names[0xc] = "ColumnsContentUnfrozen";
  trt_rects_names[8] = "ColumnsClipRect";
  trt_rects_names[9] = "ColumnsContentHeadersUsed";
  trt_rects_names[10] = "ColumnsContentHeadersIdeal";
  trt_rects_names[0xb] = "ColumnsContentFrozen";
  trt_rects_names[4] = "InnerClipRect";
  trt_rects_names[5] = "BackgroundClipRect";
  trt_rects_names[6] = "ColumnsRect";
  trt_rects_names[7] = "ColumnsWorkRect";
  trt_rects_names[0] = PTR_anon_var_dwarf_13bdfb_002a5a30;
  trt_rects_names[1] = PTR_anon_var_dwarf_13be13_002a5a38;
  trt_rects_names[2] = (char *)_UNK_002a5a40;
  trt_rects_names[3] = (char *)_UNK_002a5a48;
  local_1c0 = &(pIVar22->DebugMetricsConfig).ShowWindowsRectsType;
  if ((pIVar22->DebugMetricsConfig).ShowWindowsRectsType < 0) {
    *local_1c0 = 4;
  }
  local_1b8 = &(pIVar22->DebugMetricsConfig).ShowTablesRectsType;
  if ((pIVar22->DebugMetricsConfig).ShowTablesRectsType < 0) {
    *local_1b8 = 2;
  }
  local_1c8 = &pIVar22->DebugMetricsConfig;
  auVar37 = ZEXT1664(auVar7._0_16_);
  auVar47 = ZEXT1664(auVar45);
  auVar59 = ZEXT1664(auVar57);
  bVar11 = TreeNode("Tools");
  local_1d0 = pIVar22;
  if (bVar11) {
    auVar57._8_8_ = 0;
    auVar57[0] = buf[8];
    auVar57[1] = buf[9];
    auVar57[2] = buf[10];
    auVar57[3] = buf[0xb];
    auVar57[4] = buf[0xc];
    auVar57[5] = buf[0xd];
    auVar57[6] = buf[0xe];
    auVar57[7] = buf[0xf];
    buf._0_16_ = auVar57 << 0x40;
    bVar11 = Button("Item Picker..",(ImVec2 *)buf);
    if (bVar11) {
      GImGui->DebugItemPickerActive = true;
    }
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    TextDisabled("(?)");
    bVar11 = IsItemHovered(0);
    if (bVar11) {
      BeginTooltipEx(0,0);
      PushTextWrapPos(GImGui->FontSize * 35.0);
      TextUnformatted("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                      ,(char *)0x0);
      PopTextWrapPos();
      EndTooltip();
    }
    Checkbox("Show windows begin order",&(pIVar22->DebugMetricsConfig).ShowWindowsBeginOrder);
    Checkbox("Show windows rectangles",&local_1c8->ShowWindowsRects);
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    fVar27 = pIVar8->FontSize;
    *(byte *)&(pIVar8->NextItemData).Flags = (byte)(pIVar8->NextItemData).Flags | 1;
    (pIVar8->NextItemData).Width = fVar27 * 12.0;
    bVar11 = Combo("##show_windows_rect_type",local_1c0,wrt_rects_names,8,8);
    local_1c8->ShowWindowsRects = (bool)(local_1c8->ShowWindowsRects | bVar11);
    if ((local_1c8->ShowWindowsRects != false) && (pIVar22->NavWindow != (ImGuiWindow *)0x0)) {
      lVar16 = 0;
      BulletText("\'%s\':",pIVar22->NavWindow->Name);
      pIVar8 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar27 = (pIVar8->Style).IndentSpacing + (pIVar3->DC).Indent.x;
      (pIVar3->DC).Indent.x = fVar27;
      fVar27 = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      auVar37 = ZEXT464((uint)fVar27);
      (pIVar3->DC).CursorPos.x = fVar27;
      do {
        auVar53 = auVar47._8_56_;
        auVar43 = auVar37._8_56_;
        IVar61 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar22->NavWindow,(int)lVar16);
        auVar47._0_8_ = IVar61.Max;
        auVar47._8_56_ = auVar53;
        auVar37._0_8_ = IVar61.Min;
        auVar37._8_56_ = auVar43;
        dVar56 = (double)IVar61.Min.x;
        auVar57 = vmovshdup_avx(auVar37._0_16_);
        auVar58._0_8_ = (double)auVar57._0_4_;
        auVar58._8_8_ = auVar57._8_8_;
        auVar59 = ZEXT1664(auVar58);
        auVar45 = vmovshdup_avx(auVar47._0_16_);
        auVar37 = ZEXT1664(CONCAT88(auVar43._0_8_,dVar56));
        auVar47 = ZEXT1664(auVar58);
        Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",dVar56,auVar58._0_8_,
             (double)IVar61.Max.x,(double)auVar45._0_4_,(double)(IVar61.Max.x - IVar61.Min.x),
             (double)(auVar45._0_4_ - auVar57._0_4_),wrt_rects_names[lVar16]);
        pIVar8 = GImGui;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 8);
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar27 = (pIVar3->DC).Indent.x - (pIVar8->Style).IndentSpacing;
      (pIVar3->DC).Indent.x = fVar27;
      (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    }
    Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar22->DebugMetricsConfig).ShowDrawCmdMesh);
    Checkbox("Show ImDrawCmd bounding boxes when hovering",
             &(pIVar22->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
    v = &(pIVar22->DebugMetricsConfig).ShowTablesRects;
    Checkbox("Show tables rectangles",v);
    pIVar22 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar22->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    fVar27 = pIVar22->FontSize * 12.0;
    auVar37 = ZEXT464((uint)fVar27);
    *(byte *)&(pIVar22->NextItemData).Flags = (byte)(pIVar22->NextItemData).Flags | 1;
    (pIVar22->NextItemData).Width = fVar27;
    bVar11 = Combo("##show_table_rects_type",local_1b8,trt_rects_names,0xd,0xd);
    *v = (bool)(*v | bVar11);
    pIVar22 = local_1d0;
    if (((*v != false) && (local_1d0->NavWindow != (ImGuiWindow *)0x0)) &&
       (0 < (local_1d0->Tables).Buf.Size)) {
      auVar14 = (undefined1  [8])0x0;
      do {
        pIVar17 = (pIVar22->Tables).Buf.Data;
        if (pIVar22->FrameCount + -1 <= pIVar17[(long)auVar14].LastFrameActive) {
          pIVar17 = pIVar17 + (long)auVar14;
          if ((pIVar17->OuterWindow == pIVar22->NavWindow) ||
             (pIVar17->InnerWindow == pIVar22->NavWindow)) {
            local_188 = auVar14;
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar17->ID,
                       (ulong)(uint)pIVar17->ColumnsCount,pIVar17->OuterWindow->Name);
            bVar11 = IsItemHovered(0);
            if (bVar11) {
              pIVar12 = GetForegroundDrawList();
              IVar1 = (pIVar17->OuterRect).Min;
              auVar28._0_4_ = IVar1.x + -1.0;
              auVar28._4_4_ = IVar1.y + -1.0;
              auVar28._8_4_ = 0xbf800000;
              auVar28._12_4_ = 0xbf800000;
              uVar60 = vmovlps_avx(auVar28);
              buf[0] = (char)uVar60;
              buf[1] = (char)((ulong)uVar60 >> 8);
              buf[2] = (char)((ulong)uVar60 >> 0x10);
              buf[3] = (char)((ulong)uVar60 >> 0x18);
              buf[4] = (char)((ulong)uVar60 >> 0x20);
              buf[5] = (char)((ulong)uVar60 >> 0x28);
              buf[6] = (char)((ulong)uVar60 >> 0x30);
              buf[7] = (char)((ulong)uVar60 >> 0x38);
              IVar1 = (pIVar17->OuterRect).Max;
              auVar29._0_4_ = IVar1.x + 1.0;
              auVar29._4_4_ = IVar1.y + 1.0;
              auVar29._8_4_ = 0x3f800000;
              auVar29._12_4_ = 0x3f800000;
              local_1d8 = (ImVec2)vmovlps_avx(auVar29);
              auVar47 = ZEXT464(0x40000000);
              ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,&local_1d8,0xff00ffff,0.0,-1,2.0);
            }
            pIVar22 = GImGui;
            pIVar3 = GImGui->CurrentWindow;
            pIVar3->WriteAccessed = true;
            fVar27 = (pIVar22->Style).IndentSpacing + (pIVar3->DC).Indent.x;
            (pIVar3->DC).Indent.x = fVar27;
            fVar27 = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
            auVar37 = ZEXT464((uint)fVar27);
            (pIVar3->DC).CursorPos.x = fVar27;
            uVar26 = 0;
            do {
              auVar53 = auVar47._8_56_;
              auVar43 = auVar37._8_56_;
              iVar18 = (int)uVar26;
              if (uVar26 < 6) {
                IVar61 = ShowMetricsWindow::Funcs::GetTableRect(pIVar17,iVar18,-1);
                auVar49._0_8_ = IVar61.Max;
                auVar49._8_56_ = auVar53;
                auVar59._0_8_ = IVar61.Min;
                auVar59._8_56_ = auVar43;
                _local_198 = auVar59._0_16_;
                auVar59 = ZEXT1664(_local_198);
                _local_1a8 = auVar49._0_16_;
                auVar57 = vmovshdup_avx(_local_1a8);
                auVar45 = vmovshdup_avx(_local_198);
                dVar56 = (double)IVar61.Min.x;
                auVar37 = ZEXT1664(CONCAT88(auVar43._0_8_,dVar56));
                dVar44 = (double)auVar45._0_4_;
                auVar47 = ZEXT1664(CONCAT88(auVar45._8_8_,dVar44));
                ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",dVar56,
                               dVar44,(double)IVar61.Max.x,(double)auVar57._0_4_,
                               (double)(IVar61.Max.x - IVar61.Min.x),
                               (double)(auVar57._0_4_ - auVar45._0_4_),trt_rects_names[uVar26]);
                local_1d8.x = 0.0;
                local_1d8.y = 0.0;
                Selectable(buf,false,0,&local_1d8);
                bVar11 = IsItemHovered(0);
                if (bVar11) {
                  pIVar12 = GetForegroundDrawList();
                  auVar32._0_4_ = (float)local_198._0_4_ + -1.0;
                  auVar32._4_4_ = (float)local_198._4_4_ + -1.0;
                  auVar32._8_4_ = fStack_190 + -1.0;
                  auVar32._12_4_ = fStack_18c + -1.0;
                  local_1d8 = (ImVec2)vmovlps_avx(auVar32);
                  auVar33._0_4_ = (float)local_1a8._0_4_ + 1.0;
                  auVar33._4_4_ = (float)local_1a8._4_4_ + 1.0;
                  auVar33._8_4_ = fStack_1a0 + 1.0;
                  auVar33._12_4_ = fStack_19c + 1.0;
                  local_1b0 = (ImVec2)vmovlps_avx(auVar33);
                  auVar37 = ZEXT464(0) << 0x20;
                  auVar47 = ZEXT464(0x40000000);
                  ImDrawList::AddRect(pIVar12,&local_1d8,&local_1b0,0xff00ffff,0.0,-1,2.0);
                }
              }
              else if (((iVar18 == 8) || (iVar18 == 6)) && (0 < pIVar17->ColumnsCount)) {
                uVar25 = 0;
                do {
                  auVar53 = auVar47._8_56_;
                  auVar43 = auVar37._8_56_;
                  IVar61 = ShowMetricsWindow::Funcs::GetTableRect(pIVar17,iVar18,(int)uVar25);
                  auVar48._0_8_ = IVar61.Max;
                  auVar48._8_56_ = auVar53;
                  auVar38._0_8_ = IVar61.Min;
                  auVar38._8_56_ = auVar43;
                  _local_198 = auVar38._0_16_;
                  auVar59 = ZEXT1664(_local_198);
                  _local_1a8 = auVar48._0_16_;
                  auVar57 = vmovshdup_avx(_local_1a8);
                  auVar45 = vmovshdup_avx(_local_198);
                  dVar56 = (double)IVar61.Min.x;
                  auVar37 = ZEXT1664(CONCAT88(auVar43._0_8_,dVar56));
                  dVar44 = (double)auVar45._0_4_;
                  auVar47 = ZEXT1664(CONCAT88(auVar45._8_8_,dVar44));
                  ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s"
                                 ,dVar56,dVar44,(double)IVar61.Max.x,(double)auVar57._0_4_,
                                 (double)(IVar61.Max.x - IVar61.Min.x),
                                 (double)(auVar57._0_4_ - auVar45._0_4_),uVar25,
                                 trt_rects_names[uVar26]);
                  local_1d8.x = 0.0;
                  local_1d8.y = 0.0;
                  Selectable(buf,false,0,&local_1d8);
                  bVar11 = IsItemHovered(0);
                  if (bVar11) {
                    pIVar12 = GetForegroundDrawList();
                    auVar30._0_4_ = (float)local_198._0_4_ + -1.0;
                    auVar30._4_4_ = (float)local_198._4_4_ + -1.0;
                    auVar30._8_4_ = fStack_190 + -1.0;
                    auVar30._12_4_ = fStack_18c + -1.0;
                    local_1d8 = (ImVec2)vmovlps_avx(auVar30);
                    auVar31._0_4_ = (float)local_1a8._0_4_ + 1.0;
                    auVar31._4_4_ = (float)local_1a8._4_4_ + 1.0;
                    auVar31._8_4_ = fStack_1a0 + 1.0;
                    auVar31._12_4_ = fStack_19c + 1.0;
                    local_1b0 = (ImVec2)vmovlps_avx(auVar31);
                    auVar37 = ZEXT464(0) << 0x20;
                    auVar47 = ZEXT464(0x40000000);
                    ImDrawList::AddRect(pIVar12,&local_1d8,&local_1b0,0xff00ffff,0.0,-1,2.0);
                  }
                  uVar24 = (int)uVar25 + 1;
                  uVar25 = (ulong)uVar24;
                } while ((int)uVar24 < pIVar17->ColumnsCount);
              }
              pIVar22 = GImGui;
              uVar26 = uVar26 + 1;
            } while (uVar26 != 0xd);
            pIVar3 = GImGui->CurrentWindow;
            pIVar3->WriteAccessed = true;
            fVar27 = (pIVar3->DC).Indent.x - (pIVar22->Style).IndentSpacing;
            (pIVar3->DC).Indent.x = fVar27;
            fVar27 = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
            auVar37 = ZEXT464((uint)fVar27);
            (pIVar3->DC).CursorPos.x = fVar27;
            auVar14 = local_188;
            pIVar22 = local_1d0;
          }
        }
        auVar14 = (undefined1  [8])((long)auVar14 + 1);
      } while ((long)auVar14 < (long)(pIVar22->Tables).Buf.Size);
    }
    TreePop();
  }
  local_1a8 = (undefined1  [8])&pIVar22->Windows;
  DebugNodeWindowsList(&pIVar22->Windows,"Windows");
  lVar16 = (long)(pIVar22->Viewports).Size;
  if (lVar16 < 1) {
    uVar26 = 0;
  }
  else {
    lVar20 = 0;
    uVar26 = 0;
    do {
      pIVar4 = (pIVar22->Viewports).Data[lVar20];
      uVar24 = (pIVar4->DrawDataBuilder).Layers[1].Size;
      auVar47 = ZEXT464(uVar24);
      auVar57 = vpaddd_avx(ZEXT416((uint)(pIVar4->DrawDataBuilder).Layers[0].Size),ZEXT416(uVar24));
      auVar37 = ZEXT1664(auVar57);
      uVar26 = (ulong)(uint)((int)uVar26 + auVar57._0_4_);
      lVar20 = lVar20 + 1;
    } while (lVar16 != lVar20);
  }
  bVar11 = TreeNode("DrawLists","DrawLists (%d)",uVar26);
  if (bVar11) {
    if (0 < (pIVar22->Viewports).Size) {
      lVar16 = 0;
      do {
        pIVar4 = (pIVar22->Viewports).Data[lVar16];
        lVar20 = 0;
        do {
          if (0 < (pIVar4->DrawDataBuilder).Layers[lVar20].Size) {
            pIVar23 = (pIVar4->DrawDataBuilder).Layers + lVar20;
            lVar19 = 0;
            do {
              DebugNodeDrawList((ImGuiWindow *)0x0,pIVar23->Data[lVar19],"DrawList");
              lVar19 = lVar19 + 1;
            } while (lVar19 < pIVar23->Size);
          }
          bVar11 = lVar20 == 0;
          lVar20 = lVar20 + 1;
        } while (bVar11);
        lVar16 = lVar16 + 1;
        pIVar22 = local_1d0;
      } while (lVar16 < (local_1d0->Viewports).Size);
    }
    TreePop();
  }
  bVar11 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar22->Viewports).Size);
  if (bVar11) {
    fVar27 = GetTreeNodeToLabelSpacing();
    pIVar22 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if ((fVar27 == 0.0) && (!NAN(fVar27))) {
      fVar27 = (pIVar22->Style).IndentSpacing;
    }
    fVar27 = fVar27 + (pIVar3->DC).Indent.x;
    (pIVar3->DC).Indent.x = fVar27;
    fVar27 = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    (pIVar3->DC).CursorPos.x = fVar27;
    iVar18 = (pIVar22->Viewports).Size;
    if ((long)iVar18 < 1) {
      fStack_180 = 3.4028235e+38;
      local_188 = (undefined1  [8])0x7f7fffff7f7fffff;
      fStack_17c = 3.4028235e+38;
      local_178._8_4_ = 0xff7fffff;
      local_178._0_8_ = 0xff7fffffff7fffff;
      local_178._12_4_ = 0xff7fffff;
    }
    else {
      fStack_180 = 3.4028235e+38;
      local_188 = (undefined1  [8])0x7f7fffff7f7fffff;
      fStack_17c = 3.4028235e+38;
      local_178._8_4_ = 0xff7fffff;
      local_178._0_8_ = 0xff7fffffff7fffff;
      local_178._12_4_ = 0xff7fffff;
      lVar16 = 0;
      do {
        pIVar4 = (pIVar22->Viewports).Data[lVar16];
        IVar1 = (pIVar4->super_ImGuiViewport).Pos;
        auVar46._8_8_ = 0;
        auVar46._0_4_ = IVar1.x;
        auVar46._4_4_ = IVar1.y;
        IVar2 = (pIVar4->super_ImGuiViewport).Size;
        auVar54._0_4_ = IVar1.x + IVar2.x;
        auVar54._4_4_ = IVar1.y + IVar2.y;
        auVar54._8_8_ = 0;
        local_178 = vmaxps_avx(auVar54,local_178);
        _local_188 = vminps_avx(auVar46,_local_188);
        lVar16 = lVar16 + 1;
      } while (iVar18 != lVar16);
    }
    if (0 < iVar18) {
      auVar57 = vinsertps_avx(ZEXT416((uint)fVar27),ZEXT416((uint)(pIVar3->DC).CursorPos.y),0x10);
      local_198._4_4_ = auVar57._4_4_ + (float)local_188._4_4_ * -0.125;
      local_198._0_4_ = auVar57._0_4_ + (float)local_188._0_4_ * -0.125;
      fStack_190 = auVar57._8_4_ + fStack_180 * -0.125;
      fStack_18c = auVar57._12_4_ + fStack_17c * -0.125;
      lVar16 = 0;
      do {
        pIVar4 = (pIVar22->Viewports).Data[lVar16];
        IVar1 = (pIVar4->super_ImGuiViewport).Pos;
        IVar2 = (pIVar4->super_ImGuiViewport).Size;
        fVar27 = IVar1.x;
        fVar42 = IVar1.y;
        auVar55._0_4_ = (float)local_198._0_4_ + fVar27 * 0.125;
        auVar55._4_4_ = (float)local_198._4_4_ + fVar42 * 0.125;
        auVar55._8_4_ = fStack_190 + 0.0;
        auVar55._12_4_ = fStack_18c + 0.0;
        auVar34._0_4_ = (float)local_198._0_4_ + (fVar27 + IVar2.x) * 0.125;
        auVar34._4_4_ = (float)local_198._4_4_ + (fVar42 + IVar2.y) * 0.125;
        auVar34._8_4_ = fStack_190 + 0.0;
        auVar34._12_4_ = fStack_18c + 0.0;
        buf._0_16_ = vmovlhps_avx(auVar55,auVar34);
        DebugRenderViewportThumbnail(pIVar3->DrawList,pIVar4,(ImRect *)buf);
        lVar16 = lVar16 + 1;
      } while (lVar16 < (pIVar22->Viewports).Size);
    }
    auVar57 = vsubps_avx(local_178,_local_188);
    auVar35._0_4_ = auVar57._0_4_ * 0.125;
    auVar35._4_4_ = auVar57._4_4_ * 0.125;
    auVar35._8_4_ = auVar57._8_4_ * 0.125;
    auVar35._12_4_ = auVar57._12_4_ * 0.125;
    uVar60 = vmovlps_avx(auVar35);
    buf[0] = (char)uVar60;
    buf[1] = (char)((ulong)uVar60 >> 8);
    buf[2] = (char)((ulong)uVar60 >> 0x10);
    buf[3] = (char)((ulong)uVar60 >> 0x18);
    buf[4] = (char)((ulong)uVar60 >> 0x20);
    buf[5] = (char)((ulong)uVar60 >> 0x28);
    buf[6] = (char)((ulong)uVar60 >> 0x30);
    buf[7] = (char)((ulong)uVar60 >> 0x38);
    Dummy((ImVec2 *)buf);
    fVar27 = GetTreeNodeToLabelSpacing();
    pIVar22 = local_1d0;
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if ((fVar27 == 0.0) && (!NAN(fVar27))) {
      fVar27 = (pIVar8->Style).IndentSpacing;
    }
    fVar42 = (pIVar3->DC).Indent.x;
    auVar47 = ZEXT464((uint)fVar42);
    fVar42 = fVar42 - fVar27;
    (pIVar3->DC).Indent.x = fVar42;
    fVar27 = fVar42 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    auVar37 = ZEXT464((uint)fVar27);
    (pIVar3->DC).CursorPos.x = fVar27;
    if (0 < (local_1d0->Viewports).Size) {
      lVar16 = 0;
      do {
        DebugNodeViewport((pIVar22->Viewports).Data[lVar16]);
        lVar16 = lVar16 + 1;
      } while (lVar16 < (pIVar22->Viewports).Size);
    }
    TreePop();
  }
  bVar11 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar22->OpenPopupStack).Size);
  if (bVar11) {
    if (0 < (pIVar22->OpenPopupStack).Size) {
      lVar20 = 8;
      lVar16 = 0;
      do {
        pIVar5 = (pIVar22->OpenPopupStack).Data;
        puVar6 = *(undefined8 **)((long)&pIVar5->PopupId + lVar20);
        pcVar15 = "NULL";
        if (puVar6 != (undefined8 *)0x0) {
          pcVar15 = (char *)*puVar6;
        }
        pcVar13 = "";
        if ((puVar6 != (undefined8 *)0x0) &&
           (pcVar13 = " ChildWindow", (*(byte *)((long)puVar6 + 0xf) & 1) == 0)) {
          pcVar13 = "";
        }
        pcVar21 = "";
        if ((puVar6 != (undefined8 *)0x0) &&
           (pcVar21 = " ChildMenu", (*(byte *)((long)puVar6 + 0xf) & 0x10) == 0)) {
          pcVar21 = "";
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)*(uint *)((long)pIVar5 + lVar20 + -8),
                   pcVar15,pcVar13,pcVar21);
        lVar16 = lVar16 + 1;
        lVar20 = lVar20 + 0x30;
        pIVar22 = local_1d0;
      } while (lVar16 < (local_1d0->OpenPopupStack).Size);
    }
    TreePop();
  }
  bVar11 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar22->TabBars).Buf.Size);
  if (bVar11) {
    if (0 < (pIVar22->TabBars).Buf.Size) {
      lVar16 = 0;
      lVar20 = 0;
      do {
        DebugNodeTabBar((ImGuiTabBar *)((long)&(((pIVar22->TabBars).Buf.Data)->Tabs).Size + lVar16),
                        "TabBar");
        lVar20 = lVar20 + 1;
        lVar16 = lVar16 + 0x98;
      } while (lVar20 < (pIVar22->TabBars).Buf.Size);
    }
    TreePop();
  }
  bVar11 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar22->Tables).Buf.Size);
  uVar60 = auVar59._8_8_;
  if (bVar11) {
    if (0 < (pIVar22->Tables).Buf.Size) {
      lVar16 = 0;
      lVar20 = 0;
      do {
        DebugNodeTable((ImGuiTable *)((long)&((pIVar22->Tables).Buf.Data)->ID + lVar16));
        uVar60 = auVar59._8_8_;
        lVar20 = lVar20 + 1;
        lVar16 = lVar16 + 600;
      } while (lVar20 < (pIVar22->Tables).Buf.Size);
    }
    TreePop();
  }
  bVar11 = TreeNode("Settings");
  if (bVar11) {
    bVar11 = SmallButton("Clear");
    if (bVar11) {
      ClearIniSettings();
    }
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    bVar11 = SmallButton("Save to memory");
    if (bVar11) {
      SaveIniSettingsToMemory((size_t *)0x0);
    }
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    bVar11 = SmallButton("Save to disk");
    if (bVar11) {
      SaveIniSettingsToDisk((pIVar22->IO).IniFilename);
    }
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    if ((pIVar22->IO).IniFilename == (char *)0x0) {
      TextUnformatted("<NULL>",(char *)0x0);
    }
    else {
      Text("\"%s\"");
    }
    auVar37 = ZEXT1664(CONCAT88(uVar60,(double)pIVar22->SettingsDirtyTimer));
    Text("SettingsDirtyTimer %.2f",(double)pIVar22->SettingsDirtyTimer);
    bVar11 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                      (ulong)(uint)(pIVar22->SettingsHandlers).Size);
    if (bVar11) {
      if (0 < (pIVar22->SettingsHandlers).Size) {
        lVar16 = 0;
        lVar20 = 0;
        do {
          BulletText("%s",*(undefined8 *)
                           ((long)&((pIVar22->SettingsHandlers).Data)->TypeName + lVar16));
          lVar20 = lVar20 + 1;
          lVar16 = lVar16 + 0x48;
        } while (lVar20 < (pIVar22->SettingsHandlers).Size);
      }
      TreePop();
    }
    bVar11 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                      (ulong)(uint)(pIVar22->SettingsWindows).Buf.Size);
    if (bVar11) {
      pcVar15 = (pIVar22->SettingsWindows).Buf.Data;
      if (pcVar15 != (char *)0x0) {
        p = (ImGuiWindowSettings *)(pcVar15 + 4);
        do {
          Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)p->ID,p + 1,
               (ulong)(uint)(int)(p->Pos).x,(ulong)(uint)(int)(p->Pos).y,
               (ulong)(uint)(int)(p->Size).x,(ulong)(uint)(int)(p->Size).y,(ulong)p->Collapsed);
          p = ImChunkStream<ImGuiWindowSettings>::next_chunk(&pIVar22->SettingsWindows,p);
        } while (p != (ImGuiWindowSettings *)0x0);
      }
      TreePop();
    }
    bVar11 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                      (ulong)(uint)(pIVar22->SettingsTables).Buf.Size);
    if (bVar11) {
      pcVar15 = (pIVar22->SettingsTables).Buf.Data;
      if (pcVar15 != (char *)0x0) {
        settings = (ImGuiTableSettings *)(pcVar15 + 4);
        do {
          DebugNodeTableSettings(settings);
          settings = ImChunkStream<ImGuiTableSettings>::next_chunk
                               (&pIVar22->SettingsTables,settings);
        } while (settings != (ImGuiTableSettings *)0x0);
      }
      TreePop();
    }
    iVar18 = (pIVar22->SettingsIniData).Buf.Size;
    uVar26 = (ulong)(iVar18 - 1);
    if (iVar18 == 0) {
      uVar26 = 0;
    }
    bVar11 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar26);
    if (bVar11) {
      pcVar15 = (pIVar22->SettingsIniData).Buf.Data;
      if (pcVar15 == (char *)0x0) {
        pcVar15 = ImGuiTextBuffer::EmptyString;
      }
      fVar27 = GImGui->FontSize * 20.0;
      auVar37 = ZEXT464((uint)fVar27);
      buf._4_4_ = fVar27;
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = -0x80;
      buf[3] = -0x80;
      InputTextMultiline("##Ini",pcVar15,(long)(pIVar22->SettingsIniData).Buf.Size,(ImVec2 *)buf,
                         0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
      TreePop();
    }
    TreePop();
  }
  bVar11 = TreeNode("Internal state");
  if (bVar11) {
    Text("WINDOWING");
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar27 = (pIVar8->Style).IndentSpacing + (pIVar3->DC).Indent.x;
    (pIVar3->DC).Indent.x = fVar27;
    (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    pcVar13 = "NULL";
    pcVar15 = "NULL";
    if (pIVar22->HoveredWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar22->HoveredWindow->Name;
    }
    Text("HoveredWindow: \'%s\'",pcVar15);
    pcVar15 = "NULL";
    if (pIVar22->HoveredRootWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar22->HoveredRootWindow->Name;
    }
    Text("HoveredRootWindow: \'%s\'",pcVar15);
    pcVar15 = "NULL";
    if (pIVar22->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar22->HoveredWindowUnderMovingWindow->Name;
    }
    Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar15);
    pcVar15 = "NULL";
    if (pIVar22->MovingWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar22->MovingWindow->Name;
    }
    Text("MovingWindow: \'%s\'",pcVar15);
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar27 = (pIVar3->DC).Indent.x - (pIVar8->Style).IndentSpacing;
    (pIVar3->DC).Indent.x = fVar27;
    (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    Text("ITEMS");
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar27 = (pIVar8->Style).IndentSpacing + (pIVar3->DC).Indent.x;
    (pIVar3->DC).Indent.x = fVar27;
    (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
         (double)pIVar22->ActiveIdTimer,(ulong)pIVar22->ActiveId,
         (ulong)pIVar22->ActiveIdPreviousFrame,(ulong)pIVar22->ActiveIdAllowOverlap,
         *(undefined8 *)(&DAT_002a5aa0 + (ulong)pIVar22->ActiveIdSource * 8));
    pcVar15 = "NULL";
    if (pIVar22->ActiveIdWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar22->ActiveIdWindow->Name;
    }
    Text("ActiveIdWindow: \'%s\'",pcVar15);
    Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(double)pIVar22->HoveredIdTimer,
         (ulong)pIVar22->HoveredId,(ulong)pIVar22->HoveredIdPreviousFrame,
         (ulong)pIVar22->HoveredIdAllowOverlap);
    Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",(ulong)pIVar22->DragDropActive
         ,(ulong)(pIVar22->DragDropPayload).SourceId,(pIVar22->DragDropPayload).DataType,
         (ulong)(uint)(pIVar22->DragDropPayload).DataSize);
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar27 = (pIVar3->DC).Indent.x - (pIVar8->Style).IndentSpacing;
    (pIVar3->DC).Indent.x = fVar27;
    (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    Text("NAV,FOCUS");
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar27 = (pIVar8->Style).IndentSpacing + (pIVar3->DC).Indent.x;
    (pIVar3->DC).Indent.x = fVar27;
    (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    pcVar15 = "NULL";
    if (pIVar22->NavWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar22->NavWindow->Name;
    }
    Text("NavWindow: \'%s\'",pcVar15);
    Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar22->NavId,(ulong)pIVar22->NavLayer);
    Text("NavInputSource: %s",*(undefined8 *)(&DAT_002a5aa0 + (ulong)pIVar22->NavInputSource * 8));
    Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar22->IO).NavActive,
         (ulong)(pIVar22->IO).NavVisible);
    Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar22->NavActivateId,
         (ulong)pIVar22->NavInputId);
    Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar22->NavDisableHighlight,
         (ulong)pIVar22->NavDisableMouseHover);
    Text("NavFocusScopeId = 0x%08X",(ulong)pIVar22->NavFocusScopeId);
    if (pIVar22->NavWindowingTarget != (ImGuiWindow *)0x0) {
      pcVar13 = pIVar22->NavWindowingTarget->Name;
    }
    Text("NavWindowingTarget: \'%s\'",pcVar13);
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar27 = (pIVar3->DC).Indent.x - (pIVar8->Style).IndentSpacing;
    (pIVar3->DC).Indent.x = fVar27;
    fVar27 = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    auVar37 = ZEXT464((uint)fVar27);
    (pIVar3->DC).CursorPos.x = fVar27;
    TreePop();
  }
  if (((local_1c8->ShowWindowsRects != false) ||
      ((pIVar22->DebugMetricsConfig).ShowWindowsBeginOrder == true)) && (0 < *(int *)local_1a8)) {
    lVar16 = 0;
    do {
      pIVar3 = (pIVar22->Windows).Data[lVar16];
      if (pIVar3->WasActive == true) {
        pIVar12 = GetForegroundDrawList();
        auVar53 = auVar47._8_56_;
        auVar43 = auVar37._8_56_;
        if (local_1c8->ShowWindowsRects == true) {
          IVar61 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar3,*local_1c0);
          auVar50._0_8_ = IVar61.Max;
          auVar50._8_56_ = auVar53;
          auVar39._0_8_ = IVar61.Min;
          auVar39._8_56_ = auVar43;
          buf._0_16_ = vmovlhps_avx(auVar39._0_16_,auVar50._0_16_);
          auVar37 = ZEXT864(0) << 0x20;
          auVar47 = ZEXT464(0x3f800000);
          ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
        }
        if (((pIVar22->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
           ((pIVar3->Flags & 0x1000000) == 0)) {
          ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar3->BeginOrderWithinContext);
          fVar27 = GImGui->FontSize;
          IVar1 = pIVar3->Pos;
          auVar47 = ZEXT864((ulong)IVar1);
          auVar36._0_4_ = fVar27 + IVar1.x;
          auVar36._4_4_ = fVar27 + IVar1.y;
          auVar36._8_4_ = fVar27 + 0.0;
          auVar36._12_4_ = fVar27 + 0.0;
          local_1d8 = (ImVec2)vmovlps_avx(auVar36);
          auVar37 = ZEXT464(0) << 0x20;
          ImDrawList::AddRectFilled(pIVar12,&pIVar3->Pos,&local_1d8,0xff6464c8,0.0,0xf);
          ImDrawList::AddText(pIVar12,&pIVar3->Pos,0xffffffff,buf,(char *)0x0);
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < *(int *)local_1a8);
  }
  if (((pIVar22->DebugMetricsConfig).ShowTablesRects == true) && (0 < (pIVar22->Tables).Buf.Size)) {
    lVar16 = 0;
    do {
      piVar9 = local_1b8;
      pIVar17 = (pIVar22->Tables).Buf.Data;
      if (pIVar22->FrameCount + -1 <= pIVar17[lVar16].LastFrameActive) {
        pIVar17 = pIVar17 + lVar16;
        pIVar12 = GetForegroundDrawList();
        piVar10 = local_1b8;
        auVar53 = auVar47._8_56_;
        auVar43 = auVar37._8_56_;
        if (*piVar9 < 6) {
          IVar61 = ShowMetricsWindow::Funcs::GetTableRect(pIVar17,*piVar9,-1);
          auVar52._0_8_ = IVar61.Max;
          auVar52._8_56_ = auVar53;
          auVar41._0_8_ = IVar61.Min;
          auVar41._8_56_ = auVar43;
          buf._0_16_ = vmovlhps_avx(auVar41._0_16_,auVar52._0_16_);
          auVar37 = ZEXT864(0) << 0x20;
          auVar47 = ZEXT464(0x3f800000);
          ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
        }
        else if (0 < pIVar17->ColumnsCount) {
          iVar18 = 0;
          do {
            auVar53 = auVar47._8_56_;
            auVar43 = auVar37._8_56_;
            IVar61 = ShowMetricsWindow::Funcs::GetTableRect(pIVar17,*piVar10,iVar18);
            auVar51._0_8_ = IVar61.Max;
            auVar51._8_56_ = auVar53;
            auVar40._0_8_ = IVar61.Min;
            auVar40._8_56_ = auVar43;
            buf._0_16_ = vmovlhps_avx(auVar40._0_16_,auVar51._0_16_);
            bVar11 = iVar18 == pIVar17->HoveredColumnBody;
            col = 0xff8000ff;
            if (bVar11) {
              col = 0xff80ffff;
            }
            auVar47 = ZEXT464((uint)*(float *)(&DAT_001e4d90 + (ulong)bVar11 * 4));
            auVar37 = ZEXT864(0) << 0x20;
            ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,(ImVec2 *)(buf + 8),col,0.0,-1,
                                *(float *)(&DAT_001e4d90 + (ulong)bVar11 * 4));
            iVar18 = iVar18 + 1;
          } while (iVar18 < pIVar17->ColumnsCount);
        }
      }
      lVar16 = lVar16 + 1;
      pIVar22 = local_1d0;
    } while (lVar16 < (local_1d0->Tables).Buf.Size);
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.GetByIndex(table_n);
                if (table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowsList(&g.WindowsFocusOrder, "WindowsFocusOrder");

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            DebugNodeTabBar(g.TabBars.GetByIndex(n), "TabBar");
        TreePop();
    }

    // Details for Tables
#ifdef IMGUI_HAS_TABLE
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            DebugNodeTable(g.Tables.GetByIndex(n));
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
            if (table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, ~0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}